

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O1

Frag __thiscall
duckdb_re2::Compiler::PostVisit
          (Compiler *this,Regexp *re,Frag param_2,Frag param_3,Frag *child_frags,int nchild_frags)

{
  CharClass CVar1;
  Rune lo;
  int n;
  CharClass *pCVar2;
  undefined1 auVar3 [13];
  undefined4 uVar4;
  undefined4 uVar5;
  Frag b;
  Frag FVar6;
  CharClass foldcase;
  uint uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 uVar10;
  EmptyOp empty;
  long lVar11;
  int *piVar12;
  Frag a;
  Frag a_00;
  Frag FVar13;
  Frag FVar14;
  Frag b_00;
  Frag b_01;
  Frag b_02;
  uint32_t local_1c8;
  uint32_t uStack_1c4;
  uint32_t uStack_1c0;
  int iStack_1bc;
  ostringstream aoStack_1a8 [112];
  ios_base local_138 [264];
  
  if (this->failed_ == true) {
switchD_01854d09_caseD_1:
    uVar8 = 0;
    uVar9 = 0;
    goto LAB_01854cc3;
  }
  switch(re->op_) {
  case '\x01':
    goto switchD_01854d09_caseD_1;
  case '\x02':
    goto switchD_01854d09_caseD_2;
  case '\x03':
    FVar13 = Literal(this,(re->arguments).rune_,(bool)((byte)re->parse_flags_ & 1));
    auVar3 = FVar13._0_13_;
    break;
  case '\x04':
    if ((re->arguments).repeat.max_ != 0) {
      uStack_1c0 = 0;
      iStack_1bc = (uint)iStack_1bc._1_3_ << 8;
      uVar9 = 0;
      if (0 < (re->arguments).repeat.max_) {
        lVar11 = 0;
        uVar8 = uVar9;
        do {
          FVar13 = Literal(this,*(Rune *)((long)&(((re->arguments).capture.name_)->_M_dataplus)._M_p
                                         + lVar11 * 4),(bool)((byte)re->parse_flags_ & 1));
          uVar9 = FVar13._0_8_;
          if (lVar11 == 0) {
            uStack_1c0 = FVar13.end.tail;
            uVar10 = FVar13.nullable;
          }
          else {
            b_01._8_8_ = FVar13._8_8_ & 0xffffffffff;
            a._12_4_ = iStack_1bc;
            a.end.tail = uStack_1c0;
            a.begin = (int)uVar8;
            a.end.head = (int)((ulong)uVar8 >> 0x20);
            b_01.begin = (int)uVar9;
            b_01.end.head = (int)((ulong)uVar9 >> 0x20);
            FVar13 = Cat(this,a,b_01);
            uVar9 = FVar13._0_8_;
            uStack_1c0 = FVar13.end.tail;
            uVar10 = FVar13.nullable;
          }
          iStack_1bc = CONCAT31(iStack_1bc._1_3_,uVar10);
          lVar11 = lVar11 + 1;
          uVar8 = uVar9;
        } while (lVar11 < (re->arguments).repeat.max_);
      }
      goto LAB_0185518e;
    }
    goto switchD_01854d09_caseD_2;
  case '\x05':
    uVar9._0_4_ = child_frags->begin;
    uVar9._4_4_ = (child_frags->end).head;
    uVar8 = *(undefined8 *)&(child_frags->end).tail;
    uStack_1c0 = (uint32_t)uVar8;
    iStack_1bc = (int)((ulong)uVar8 >> 0x20);
    if (1 < nchild_frags) {
      lVar11 = 0;
      do {
        a_00._12_4_ = iStack_1bc;
        a_00.end.tail = uStack_1c0;
        a_00.begin = (int)uVar9;
        a_00.end.head = (int)((ulong)uVar9 >> 0x20);
        b_02._8_8_ = *(undefined8 *)((long)&child_frags[1].end.tail + lVar11);
        b_02._0_8_ = *(undefined8 *)((long)&child_frags[1].begin + lVar11);
        FVar13 = Cat(this,a_00,b_02);
        uVar9 = FVar13._0_8_;
        uStack_1c0 = FVar13.end.tail;
        iStack_1bc = CONCAT31(iStack_1bc._1_3_,FVar13.nullable);
        lVar11 = lVar11 + 0x10;
      } while ((ulong)(uint)nchild_frags * 0x10 + -0x10 != lVar11);
    }
    goto LAB_0185518e;
  case '\x06':
    uVar9._0_4_ = child_frags->begin;
    uVar9._4_4_ = (child_frags->end).head;
    uVar8 = *(undefined8 *)&(child_frags->end).tail;
    uStack_1c0 = (uint32_t)uVar8;
    iStack_1bc = (int)((ulong)uVar8 >> 0x20);
    if (1 < nchild_frags) {
      lVar11 = 0;
      do {
        FVar14._12_4_ = iStack_1bc;
        FVar14.end.tail = uStack_1c0;
        FVar14.begin = (int)uVar9;
        FVar14.end.head = (int)((ulong)uVar9 >> 0x20);
        b_00._8_8_ = *(undefined8 *)((long)&child_frags[1].end.tail + lVar11);
        b_00._0_8_ = *(undefined8 *)((long)&child_frags[1].begin + lVar11);
        FVar13 = Alt(this,FVar14,b_00);
        uVar9 = FVar13._0_8_;
        uStack_1c0 = FVar13.end.tail;
        iStack_1bc = CONCAT31(iStack_1bc._1_3_,FVar13.nullable);
        lVar11 = lVar11 + 0x10;
      } while ((ulong)(uint)nchild_frags * 0x10 + -0x10 != lVar11);
    }
LAB_0185518e:
    local_1c8 = (uint32_t)uVar9;
    uStack_1c4 = (uint32_t)((ulong)uVar9 >> 0x20);
    goto LAB_018550fb;
  case '\a':
    FVar13 = Star(this,*child_frags,SUB41((re->parse_flags_ & 0x40) >> 6,0));
    auVar3 = FVar13._0_13_;
    break;
  case '\b':
    FVar13 = Plus(this,*child_frags,SUB41((re->parse_flags_ & 0x40) >> 6,0));
    auVar3 = FVar13._0_13_;
    break;
  case '\t':
    FVar13 = Quest(this,*child_frags,SUB41((re->parse_flags_ & 0x40) >> 6,0));
    auVar3 = FVar13._0_13_;
    break;
  default:
    this->failed_ = true;
    std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)aoStack_1a8,"Missing case in Compiler: ",0x1a);
    std::ostream::operator<<(aoStack_1a8,(uint)re->op_);
    goto LAB_0185513f;
  case '\v':
    n = (re->arguments).repeat.max_;
    if (n < 0) {
      uVar4 = child_frags->begin;
      uVar5 = (child_frags->end).head;
      uVar8 = *(undefined8 *)&(child_frags->end).tail;
      uStack_1c0 = (uint32_t)uVar8;
      iStack_1bc = (int)((ulong)uVar8 >> 0x20);
      local_1c8 = uVar4;
      uStack_1c4 = uVar5;
      goto LAB_018550fb;
    }
    FVar13 = Capture(this,*child_frags,n);
    auVar3 = FVar13._0_13_;
    break;
  case '\f':
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_int>,_std::allocator<std::pair<const_unsigned_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&(this->rune_cache_)._M_h);
    (this->rune_range_).begin = 0;
    (this->rune_range_).end.head = 0;
    (this->rune_range_).end.tail = 0;
    AddRuneRange(this,0,0x10ffff,false);
LAB_01854e17:
    uVar8._0_4_ = (this->rune_range_).begin;
    uVar8._4_4_ = (this->rune_range_).end.head;
    uVar9 = *(undefined8 *)&(this->rune_range_).end.tail;
    goto LAB_01854cc3;
  case '\r':
    FVar13 = ByteRange(this,0,0xff,false);
    auVar3 = FVar13._0_13_;
    break;
  case '\x0e':
    empty = this->reversed_ + kEmptyBeginLine;
    goto LAB_018550e6;
  case '\x0f':
    empty = kEmptyEndLine - this->reversed_;
    goto LAB_018550e6;
  case '\x10':
    empty = kEmptyWordBoundary;
    goto LAB_018550e6;
  case '\x11':
    empty = kEmptyNonWordBoundary;
    goto LAB_018550e6;
  case '\x12':
    uVar7 = (uint)this->reversed_;
    goto LAB_018550dc;
  case '\x13':
    uVar7 = this->reversed_ ^ 1;
LAB_018550dc:
    empty = uVar7 * 4 + kEmptyBeginText;
LAB_018550e6:
    FVar13 = EmptyWidth(this,empty);
    auVar3 = FVar13._0_13_;
    break;
  case '\x14':
    pCVar2 = (re->arguments).char_class.cc_;
    if (*(int *)(pCVar2 + 4) != 0) {
      CVar1 = *pCVar2;
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_int>,_std::allocator<std::pair<const_unsigned_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::clear(&(this->rune_cache_)._M_h);
      (this->rune_range_).begin = 0;
      (this->rune_range_).end.head = 0;
      (this->rune_range_).end.tail = 0;
      if (*(int *)(pCVar2 + 0x10) != 0) {
        piVar12 = *(int **)(pCVar2 + 8);
        do {
          if (((CVar1 == (CharClass)0x0) || (*piVar12 < 0x41)) || (0x5a < piVar12[1])) {
            lo = *piVar12;
            if (((lo < 0x42) && (0x79 < piVar12[1])) ||
               ((0x7a < lo || piVar12[1] < 0x41 ||
                (foldcase = CVar1, piVar12[1] < 0x61 && 0x5a < lo)))) {
              foldcase = (CharClass)0x0;
            }
            AddRuneRange(this,lo,piVar12[1],(bool)foldcase);
          }
          piVar12 = piVar12 + 2;
        } while (piVar12 != (int *)((long)*(int *)(pCVar2 + 0x10) * 8 + *(long *)(pCVar2 + 8)));
      }
      goto LAB_01854e17;
    }
    this->failed_ = true;
    std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)aoStack_1a8,"No ranges in char class",0x17);
LAB_0185513f:
    std::__cxx11::ostringstream::~ostringstream(aoStack_1a8);
    std::ios_base::~ios_base(local_138);
    uVar8 = 0;
    uVar9 = 0;
LAB_01854cc3:
    local_1c8 = (uint32_t)uVar8;
    uStack_1c4 = (uint32_t)((ulong)uVar8 >> 0x20);
    uStack_1c0 = (uint32_t)uVar9;
    iStack_1bc = CONCAT31(iStack_1bc._1_3_,(char)((ulong)uVar9 >> 0x20));
    goto LAB_018550fb;
  case '\x15':
    FVar13 = Match(this,(re->arguments).repeat.max_);
    local_1c8 = FVar13.begin;
    uStack_1c4 = FVar13.end.head;
    uStack_1c0 = FVar13.end.tail;
    iStack_1bc = CONCAT31(iStack_1bc._1_3_,FVar13.nullable);
    if (this->anchor_ != ANCHOR_BOTH) goto LAB_018550fb;
    FVar14 = EmptyWidth(this,kEmptyEndText);
    b._12_4_ = iStack_1bc;
    uVar8 = SUB128(FVar13._0_12_,4);
    b.begin = SUB124(FVar13._0_12_,0);
    b.end.head = (int)uVar8;
    b.end.tail = (int)((ulong)uVar8 >> 0x20);
    FVar13._8_8_ = FVar14._8_8_ & 0xffffffffff;
    FVar13.begin = (int)FVar14._0_8_;
    FVar13.end.head = (int)((ulong)FVar14._0_8_ >> 0x20);
    FVar13 = Cat(this,FVar13,b);
    auVar3 = FVar13._0_13_;
  }
LAB_018550eb:
  local_1c8 = auVar3._0_4_;
  uStack_1c4 = auVar3._4_4_;
  uStack_1c0 = auVar3._8_4_;
  iStack_1bc = CONCAT31(iStack_1bc._1_3_,auVar3[0xc]);
LAB_018550fb:
  FVar6.end.head = uStack_1c4;
  FVar6.begin = local_1c8;
  FVar6.end.tail = uStack_1c0;
  FVar6._12_4_ = iStack_1bc;
  return FVar6;
switchD_01854d09_caseD_2:
  FVar13 = Nop(this);
  auVar3 = FVar13._0_13_;
  goto LAB_018550eb;
}

Assistant:

Frag Compiler::PostVisit(Regexp* re, Frag, Frag, Frag* child_frags,
                         int nchild_frags) {
  // If a child failed, don't bother going forward, especially
  // since the child_frags might contain Frags with NULLs in them.
  if (failed_)
    return NoMatch();

  // Given the child fragments, return the fragment for this node.
  switch (re->op()) {
    case kRegexpRepeat:
      // Should not see; code at bottom of function will print error
      break;

    case kRegexpNoMatch:
      return NoMatch();

    case kRegexpEmptyMatch:
      return Nop();

    case kRegexpHaveMatch: {
      Frag f = Match(re->match_id());
      if (anchor_ == RE2::ANCHOR_BOTH) {
        // Append \z or else the subexpression will effectively be unanchored.
        // Complemented by the UNANCHORED case in CompileSet().
        f = Cat(EmptyWidth(kEmptyEndText), f);
      }
      return f;
    }

    case kRegexpConcat: {
      Frag f = child_frags[0];
      for (int i = 1; i < nchild_frags; i++)
        f = Cat(f, child_frags[i]);
      return f;
    }

    case kRegexpAlternate: {
      Frag f = child_frags[0];
      for (int i = 1; i < nchild_frags; i++)
        f = Alt(f, child_frags[i]);
      return f;
    }

    case kRegexpStar:
      return Star(child_frags[0], (re->parse_flags()&Regexp::NonGreedy) != 0);

    case kRegexpPlus:
      return Plus(child_frags[0], (re->parse_flags()&Regexp::NonGreedy) != 0);

    case kRegexpQuest:
      return Quest(child_frags[0], (re->parse_flags()&Regexp::NonGreedy) != 0);

    case kRegexpLiteral:
      return Literal(re->rune(), (re->parse_flags()&Regexp::FoldCase) != 0);

    case kRegexpLiteralString: {
      // Concatenation of literals.
      if (re->nrunes() == 0)
        return Nop();
      Frag f;
      for (int i = 0; i < re->nrunes(); i++) {
        Frag f1 = Literal(re->runes()[i],
                          (re->parse_flags()&Regexp::FoldCase) != 0);
        if (i == 0)
          f = f1;
        else
          f = Cat(f, f1);
      }
      return f;
    }

    case kRegexpAnyChar:
      BeginRange();
      AddRuneRange(0, Runemax, false);
      return EndRange();

    case kRegexpAnyByte:
      return ByteRange(0x00, 0xFF, false);

    case kRegexpCharClass: {
      CharClass* cc = re->cc();
      if (cc->empty()) {
        // This can't happen.
        failed_ = true;
        LOG(DFATAL) << "No ranges in char class";
        return NoMatch();
      }

      // ASCII case-folding optimization: if the char class
      // behaves the same on A-Z as it does on a-z,
      // discard any ranges wholly contained in A-Z
      // and mark the other ranges as foldascii.
      // This reduces the size of a program for
      // (?i)abc from 3 insts per letter to 1 per letter.
      bool foldascii = cc->FoldsASCII();

      // Character class is just a big OR of the different
      // character ranges in the class.
      BeginRange();
      for (CharClass::iterator i = cc->begin(); i != cc->end(); ++i) {
        // ASCII case-folding optimization (see above).
        if (foldascii && 'A' <= i->lo && i->hi <= 'Z')
          continue;

        // If this range contains all of A-Za-z or none of it,
        // the fold flag is unnecessary; don't bother.
        bool fold = foldascii;
        if ((i->lo <= 'A' && 'z' <= i->hi) || i->hi < 'A' || 'z' < i->lo ||
            ('Z' < i->lo && i->hi < 'a'))
          fold = false;

        AddRuneRange(i->lo, i->hi, fold);
      }
      return EndRange();
    }

    case kRegexpCapture:
      // If this is a non-capturing parenthesis -- (?:foo) --
      // just use the inner expression.
      if (re->cap() < 0)
        return child_frags[0];
      return Capture(child_frags[0], re->cap());

    case kRegexpBeginLine:
      return EmptyWidth(reversed_ ? kEmptyEndLine : kEmptyBeginLine);

    case kRegexpEndLine:
      return EmptyWidth(reversed_ ? kEmptyBeginLine : kEmptyEndLine);

    case kRegexpBeginText:
      return EmptyWidth(reversed_ ? kEmptyEndText : kEmptyBeginText);

    case kRegexpEndText:
      return EmptyWidth(reversed_ ? kEmptyBeginText : kEmptyEndText);

    case kRegexpWordBoundary:
      return EmptyWidth(kEmptyWordBoundary);

    case kRegexpNoWordBoundary:
      return EmptyWidth(kEmptyNonWordBoundary);
  }
  failed_ = true;
  LOG(DFATAL) << "Missing case in Compiler: " << re->op();
  return NoMatch();
}